

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTApt.cpp
# Opt level: O1

bool LTAptDump(string *_aptId)

{
  pointer pRVar1;
  pointer pSVar2;
  pointer pTVar3;
  pointer puVar4;
  size_t sVar5;
  size_t sVar6;
  const_iterator cVar7;
  long *plVar8;
  ostream *poVar9;
  long lVar10;
  size_t sVar11;
  pointer puVar12;
  long *plVar13;
  ulong uVar14;
  RwyEndPt *re;
  pointer pRVar15;
  pointer pSVar16;
  char *pcVar17;
  pointer pTVar18;
  pointer pTVar19;
  StartupLoc *loc_1;
  long lVar20;
  TaxiNode *n;
  pointer pTVar21;
  bool bVar22;
  string fileName;
  ofstream out;
  char local_261;
  mapped_type *local_260;
  long *local_258;
  long local_250;
  long local_248;
  long lStack_240;
  pointer local_238;
  undefined1 local_230 [8];
  undefined8 local_228;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_220 [14];
  ios_base local_138 [264];
  
  cVar7 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Apt>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Apt>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Apt>_>_>
          ::find(&gmapApt_abi_cxx11_._M_t,_aptId);
  if ((_Rb_tree_header *)cVar7._M_node == &gmapApt_abi_cxx11_._M_t._M_impl.super__Rb_tree_header) {
    bVar22 = false;
  }
  else {
    local_260 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Apt,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Apt>_>_>
                ::at(&gmapApt_abi_cxx11_,_aptId);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_230,
                   &dataRefs.XPSystemPath,_aptId);
    plVar8 = (long *)std::__cxx11::string::append(local_230);
    local_258 = &local_248;
    plVar13 = plVar8 + 2;
    if ((long *)*plVar8 == plVar13) {
      local_248 = *plVar13;
      lStack_240 = plVar8[3];
    }
    else {
      local_248 = *plVar13;
      local_258 = (long *)*plVar8;
    }
    local_250 = plVar8[1];
    *plVar8 = (long)plVar13;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    if (local_230 != (undefined1  [8])local_220) {
      operator_delete((void *)local_230,local_220[0]._M_allocated_capacity + 1);
    }
    std::ofstream::ofstream(local_230,(string *)&local_258,_S_trunc|_S_out);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_230,
               "type,BOT,symbol,color,rotation,latitude,longitude,time,speed,course,name,desc\n",
               0x4e);
    *(undefined8 *)((long)&local_228 + *(long *)((long)local_230 + -0x18)) = 0xb;
    pRVar15 = (local_260->vecRwyEndPts).super__Vector_base<RwyEndPt,_std::allocator<RwyEndPt>_>.
              _M_impl.super__Vector_impl_data._M_start;
    pRVar1 = (local_260->vecRwyEndPts).super__Vector_base<RwyEndPt,_std::allocator<RwyEndPt>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    if (pRVar15 != pRVar1) {
      do {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_230,"W,,",3);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_230,"arrow,",6);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_230,"red,",4);
        lround(pRVar15->heading);
        poVar9 = std::ostream::_M_insert<long>((long)local_230);
        local_261 = ',';
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,&local_261,1);
        poVar9 = std::ostream::_M_insert<double>((pRVar15->super_TaxiNode).lat);
        local_261 = ',';
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,&local_261,1);
        poVar9 = std::ostream::_M_insert<double>((pRVar15->super_TaxiNode).lon);
        local_261 = ',';
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>(poVar9,&local_261,1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,",,,",3);
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar9,(pRVar15->id)._M_dataplus._M_p,(pRVar15->id)._M_string_length);
        local_261 = ',';
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>(poVar9,&local_261,1);
        lround(pRVar15->heading);
        poVar9 = std::ostream::_M_insert<long>((long)poVar9);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,anon_var_dwarf_1ac349,3);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
        pRVar15 = pRVar15 + 1;
      } while (pRVar15 != pRVar1);
    }
    pSVar16 = (local_260->vecStartupLocs).
              super__Vector_base<StartupLoc,_std::allocator<StartupLoc>_>._M_impl.
              super__Vector_impl_data._M_start;
    pSVar2 = (local_260->vecStartupLocs).super__Vector_base<StartupLoc,_std::allocator<StartupLoc>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pSVar16 != pSVar2) {
      do {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_230,"W,,",3);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_230,"wedge,",6);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_230,"orange,",7);
        lround(pSVar16->heading);
        poVar9 = std::ostream::_M_insert<long>((long)local_230);
        local_261 = ',';
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,&local_261,1);
        poVar9 = std::ostream::_M_insert<double>((pSVar16->super_TaxiNode).lat);
        local_261 = ',';
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,&local_261,1);
        poVar9 = std::ostream::_M_insert<double>((pSVar16->super_TaxiNode).lon);
        local_261 = ',';
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>(poVar9,&local_261,1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,",,,",3);
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar9,(pSVar16->id)._M_dataplus._M_p,(pSVar16->id)._M_string_length);
        local_261 = ',';
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>(poVar9,&local_261,1);
        lround(pSVar16->heading);
        poVar9 = std::ostream::_M_insert<long>((long)poVar9);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,anon_var_dwarf_1ac349,3);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
        pSVar16 = pSVar16 + 1;
      } while (pSVar16 != pSVar2);
    }
    pSVar16 = (local_260->vecStartupLocs).
              super__Vector_base<StartupLoc,_std::allocator<StartupLoc>_>._M_impl.
              super__Vector_impl_data._M_start;
    pSVar2 = (local_260->vecStartupLocs).super__Vector_base<StartupLoc,_std::allocator<StartupLoc>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pSVar16 != pSVar2) {
      do {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_230,"T,1,,",5);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_230,"orange,",7);
        lround(pSVar16->heading);
        poVar9 = std::ostream::_M_insert<long>((long)local_230);
        local_261 = ',';
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,&local_261,1);
        poVar9 = std::ostream::_M_insert<double>((pSVar16->super_TaxiNode).lat);
        local_261 = ',';
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,&local_261,1);
        poVar9 = std::ostream::_M_insert<double>((pSVar16->super_TaxiNode).lon);
        local_261 = ',';
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>(poVar9,&local_261,1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,",,",2);
        lround(pSVar16->heading);
        poVar9 = std::ostream::_M_insert<long>((long)poVar9);
        local_261 = ',';
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>(poVar9,&local_261,1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"Path leaving ",0xd);
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar9,(pSVar16->id)._M_dataplus._M_p,(pSVar16->id)._M_string_length);
        local_261 = ',';
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>(poVar9,&local_261,1);
        lround(pSVar16->heading);
        poVar9 = std::ostream::_M_insert<long>((long)poVar9);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,anon_var_dwarf_1ac349,3);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_230,"T,0,,",5);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_230,"orange,",7);
        lround(pSVar16->heading);
        poVar9 = std::ostream::_M_insert<long>((long)local_230);
        local_261 = ',';
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,&local_261,1);
        poVar9 = std::ostream::_M_insert<double>((pSVar16->viaPos).y);
        local_261 = ',';
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,&local_261,1);
        poVar9 = std::ostream::_M_insert<double>((pSVar16->viaPos).x);
        local_261 = ',';
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>(poVar9,&local_261,1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,",,",2);
        lround(pSVar16->heading);
        poVar9 = std::ostream::_M_insert<long>((long)poVar9);
        local_261 = ',';
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>(poVar9,&local_261,1);
        local_261 = ',';
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>(poVar9,&local_261,1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
        pSVar16 = pSVar16 + 1;
      } while (pSVar16 != pSVar2);
    }
    pTVar21 = (local_260->vecTaxiNodes).super__Vector_base<TaxiNode,_std::allocator<TaxiNode>_>.
              _M_impl.super__Vector_impl_data._M_start;
    pTVar18 = (local_260->vecTaxiNodes).super__Vector_base<TaxiNode,_std::allocator<TaxiNode>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    if (pTVar21 != pTVar18) {
      lVar20 = 0;
      do {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_230,"W,,",3);
        lVar10 = (long)(pTVar21->vecEdges).
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)(pTVar21->vecEdges).
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_start;
        uVar14 = lVar10 >> 3;
        if (uVar14 < 4) {
          pcVar17 = &DAT_00251364 + *(int *)(&DAT_00251364 + uVar14 * 4);
        }
        else {
          pcVar17 = "star,";
          if (lVar10 == 0x20) {
            pcVar17 = "diamond,";
          }
        }
        sVar11 = strlen(pcVar17);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_230,pcVar17,sVar11);
        pTVar3 = (local_260->vecTaxiNodes).super__Vector_base<TaxiNode,_std::allocator<TaxiNode>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        puVar12 = *(pointer *)
                   &pTVar3[lVar20].vecEdges.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl;
        puVar4 = *(pointer *)
                  ((long)&pTVar3[lVar20].vecEdges.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                  + 8);
        bVar22 = puVar12 != puVar4;
        if (puVar12 == puVar4) {
LAB_0015cfbc:
          pcVar17 = "red,";
          if ((!bVar22) &&
             (pcVar17 = "aqua,",
             (long)(pTVar21->vecEdges).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(pTVar21->vecEdges).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start == 0x10)) {
            pcVar17 = "blue,";
          }
        }
        else {
          pTVar19 = (local_260->vecTaxiEdges).
                    super__Vector_base<TaxiEdge,_std::allocator<TaxiEdge>_>._M_impl.
                    super__Vector_impl_data._M_start;
          pcVar17 = "red,";
          if (pTVar19[*puVar12].type != RUN_WAY) {
            do {
              puVar12 = puVar12 + 1;
              bVar22 = puVar12 != puVar4;
              if (puVar12 == puVar4) break;
            } while (pTVar19[*puVar12].type != RUN_WAY);
            goto LAB_0015cfbc;
          }
        }
        sVar11 = strlen(pcVar17);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_230,pcVar17,sVar11);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_230,"0,",2);
        poVar9 = std::ostream::_M_insert<double>(pTVar21->lat);
        local_261 = ',';
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,&local_261,1);
        poVar9 = std::ostream::_M_insert<double>(pTVar21->lon);
        local_261 = ',';
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>(poVar9,&local_261,1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,",,,",3);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"Node ",5);
        poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
        local_261 = ',';
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>(poVar9,&local_261,1);
        poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9," edges",6);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
        lVar20 = lVar20 + 1;
        pTVar21 = pTVar21 + 1;
      } while (pTVar21 != pTVar18);
    }
    pTVar19 = (local_260->vecTaxiEdges).super__Vector_base<TaxiEdge,_std::allocator<TaxiEdge>_>.
              _M_impl.super__Vector_impl_data._M_start;
    local_238 = (local_260->vecTaxiEdges).super__Vector_base<TaxiEdge,_std::allocator<TaxiEdge>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    if (pTVar19 != local_238) {
      do {
        pTVar21 = (local_260->vecTaxiNodes).super__Vector_base<TaxiNode,_std::allocator<TaxiNode>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        sVar5 = pTVar19->a;
        sVar6 = pTVar19->b;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_230,"T,1,,",5);
        bVar22 = pTVar19->type == RUN_WAY;
        pcVar17 = "blue,";
        if (bVar22) {
          pcVar17 = "red,";
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_230,pcVar17,(ulong)bVar22 ^ 5);
        lround(pTVar19->angle);
        poVar9 = std::ostream::_M_insert<long>((long)local_230);
        local_261 = ',';
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,&local_261,1);
        pTVar18 = pTVar21 + sVar5;
        poVar9 = std::ostream::_M_insert<double>(pTVar18->lat);
        local_261 = ',';
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,&local_261,1);
        poVar9 = std::ostream::_M_insert<double>(pTVar18->lon);
        local_261 = ',';
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>(poVar9,&local_261,1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,",,",2);
        lround(pTVar19->angle);
        poVar9 = std::ostream::_M_insert<long>((long)poVar9);
        local_261 = ',';
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>(poVar9,&local_261,1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"Edge ",5);
        poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
        local_261 = ',';
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>(poVar9,&local_261,1);
        lround(pTVar19->angle);
        poVar9 = std::ostream::_M_insert<long>((long)poVar9);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,anon_var_dwarf_1ac471,10);
        poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
        local_261 = '-';
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>(poVar9,&local_261,1);
        poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_230,"T,0,,",5);
        bVar22 = pTVar19->type == RUN_WAY;
        pcVar17 = "blue,";
        if (bVar22) {
          pcVar17 = "red,";
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_230,pcVar17,(ulong)bVar22 ^ 5);
        lround(pTVar19->angle);
        poVar9 = std::ostream::_M_insert<long>((long)local_230);
        local_261 = ',';
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,&local_261,1);
        pTVar21 = pTVar21 + sVar6;
        poVar9 = std::ostream::_M_insert<double>(pTVar21->lat);
        local_261 = ',';
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,&local_261,1);
        poVar9 = std::ostream::_M_insert<double>(pTVar21->lon);
        local_261 = ',';
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>(poVar9,&local_261,1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,",,",2);
        lround(pTVar19->angle);
        poVar9 = std::ostream::_M_insert<long>((long)poVar9);
        local_261 = ',';
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>(poVar9,&local_261,1);
        local_261 = ',';
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>(poVar9,&local_261,1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
        pTVar19 = pTVar19 + 1;
      } while (pTVar19 != local_238);
    }
    std::ofstream::close();
    local_230 = (undefined1  [8])_VTT;
    *(undefined8 *)(local_230 + *(long *)(_VTT + -0x18)) = _strtod;
    std::filebuf::~filebuf((filebuf *)&local_228);
    std::ios_base::~ios_base(local_138);
    if (local_258 != &local_248) {
      operator_delete(local_258,local_248 + 1);
    }
    bVar22 = true;
  }
  return bVar22;
}

Assistant:

bool LTAptDump (const std::string& _aptId)
{
    // find the airport by id
    if (gmapApt.count(_aptId) < 1) return false;
    try {
        const Apt& apt = gmapApt.at(_aptId);
        
        // open the output file
        const std::string fileName (dataRefs.GetXPSystemPath() + _aptId + ".csv");
        std::ofstream out (fileName, std::ios_base::out | std::ios_base::trunc);
        // column headers
        out << "type,BOT,symbol,color,rotation,latitude,longitude,time,speed,course,name,desc\n";
        out.precision(11);               // precision is all digits, so we need something like 123.45678901
        
        // Dump all rwy endpoints as Waypoints
        for (const RwyEndPt& re: apt.GetRwyEndPtVec())
            out
            << "W,,"                                    // type, BOT
            << "arrow,"                                 // symbol
            << "red,"                                   // color
            << std::lround(re.heading) << ','           // rotation
            << re.lat << ',' << re.lon << ','           // latitude,longitude
            << ",,,"                                    // time,speed,course
            << re.id << ','                             // name
            << std::lround(re.heading) << "°,"          // desc
            << "\n";
        
        // Dump all startup locations as Waypoints
        for (const StartupLoc& loc: apt.GetStartupLocVec())
            out
            << "W,,"                                    // type, BOT
            << "wedge,"                                 // symbol
            << "orange,"                                // color
            << std::lround(loc.heading) << ','          // rotation
            << loc.lat << ',' << loc.lon << ','         // latitude,longitude
            << ",,,"                                    // time,speed,course
            << loc.id << ','                            // name
            << std::lround(loc.heading) << "°,"         // desc
            << "\n";
        
        // Dump all startup paths as tracks
        for (const StartupLoc& loc: apt.GetStartupLocVec())
        {
            out
            << "T,1,,"                                  // type, BOT, symbol
            << "orange,"                                // color
            << std::lround(loc.heading) << ','          // rotation
            << loc.lat << ',' << loc.lon << ','         // latitude,longitude
            << ",,"                                     // time,speed
            << std::lround(loc.heading) << ','          // course
            << "Path leaving " << loc.id << ','         // name
            << std::lround(loc.heading) << "°,"         // desc
            << "\n";

            out
            << "T,0,,"                                  // type, BOT, symbol
            << "orange,"                                // color
            << std::lround(loc.heading) << ','          // rotation
            << loc.viaPos.y << ',' << loc.viaPos.x << ','  // latitude,longitude
            << ",,"                                     // time,speed
            << std::lround(loc.heading) << ','          // course
            << ','                                      // name, desc
            << "\n";

        }
        
        // Dump all nodes as Waypoints
        size_t i = 0;
        for (const TaxiNode& n: apt.GetTaxiNodesVec()) {
            out
            << "W,,"                                    // type, BOT
            << (n.vecEdges.size() == 0 ? "pin," :       // symbol
                n.vecEdges.size() == 1 ? "circle," :
                n.vecEdges.size() == 2 ? "square," :
                n.vecEdges.size() == 3 ? "triangle," :
                n.vecEdges.size() == 4 ? "diamond," : "star,")
            << (apt.IsConnectedToRwy(i) ? "red," :        // color: red if rwy, blue if 2 edges, else auqa
                n.vecEdges.size() == 2 ? "blue," : "aqua,")
            << "0,"                                     // rotation
            << n.lat << ',' << n.lon << ','             // latitude,longitude
            << ",,,"                                    // time,speed,course
            << "Node " << i << ','                      // name
            << n.vecEdges.size() << " edges"            // desc
            << "\n";
            i++;
        }
        
        // Dump all edges as Tracks
        i = 0;
        for (const TaxiEdge& e: apt.GetTaxiEdgeVec())
        {
            const TaxiNode& a = e.GetA(apt);
            const TaxiNode& b = e.GetB(apt);
            
            out
            << "T,1,,"                                  // type, BOT, symbol
            << (e.GetType() == TaxiEdge::RUN_WAY ? "red," : "blue,")  // color
            << std::lround(e.angle) << ','              // rotation
            << a.lat << ',' << a.lon << ','             // latitude,longitude
            << ",,"                                     // time,speed
            << std::lround(e.angle) << ','              // course
            << "Edge " << (i++) << ','                  // name
            << std::lround(e.angle) << "°, nodes " << e.startNode() << '-' << e.endNode() // desc
            << "\n";

            out
            << "T,0,,"                                  // type, BOT, symbol
            << (e.GetType() == TaxiEdge::RUN_WAY ? "red," : "blue,")  // color
            << std::lround(e.angle) << ','              // rotation
            << b.lat << ',' << b.lon << ','             // latitude,longitude
            << ",,"                                     // time,speed
            << std::lround(e.angle) << ','              // course
            << ','                                      // name, desc
            << "\n";

        }
            
#ifdef DEBUG
        // Dump all Bezier handles
        for (auto iter = apt.vecBezierHandles.cbegin();
             iter != apt.vecBezierHandles.cend();
             ++iter)
        {
            const TaxiNode& a = *iter;
            const TaxiNode& b = *(++iter);
            
            out
            << "T,1,,"                                  // type, BOT, symbol
            << (a.bVisited ? "orange," : "magenta,")    // color (mirrored control point or not?)
            <<  ','                                     // rotation
            << a.lat << ',' << a.lon << ','             // latitude,longitude
            << ",,"                                     // time,speed
            << ','                                      // course
            << "Bezier Handle Ln " << a.prevIdx << ','  // name
            << (a.bVisited ? "mirrored" : "")           // desc
            << "\n";

            out
            << "T,0,,"                                  // type, BOT, symbol
            << (a.bVisited ? "orange," : "magenta,")    // color (mirrored control point or not?)
            <<  ','                                     // rotation
            << b.lat << ',' << b.lon << ','             // latitude,longitude
            << ",,"                                     // time,speed
            << ','                                      // course
            << ','                                      // name, desc
            << "\n";
        }
#endif
        
        // Close the file
        out.close();
        return true;
    }
    catch (...) {
        return false;
    }
}